

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

ptrdiff_t perfetto::Category::GetNthNameSize(int n,char *start,char *end,int counter)

{
  long local_40;
  long local_38;
  long local_30;
  int counter_local;
  char *end_local;
  char *start_local;
  int n_local;
  
  if ((*end == '\0') || (*end == ',')) {
    if ((*end == '\0') || (counter == n)) {
      if (counter == n) {
        local_30 = (long)end - (long)start;
      }
      else {
        local_30 = 0;
      }
      local_38 = local_30;
    }
    else {
      local_38 = GetNthNameSize(n,end + 1,end + 1,counter + 1);
    }
    local_40 = local_38;
  }
  else {
    local_40 = GetNthNameSize(n,start,end + 1,counter);
  }
  return local_40;
}

Assistant:

static constexpr ptrdiff_t GetNthNameSize(int n,
                                            const char* start,
                                            const char* end,
                                            int counter = 0) {
    return (!*end || *end == ',')
               ? ((!*end || counter == n)
                      ? (counter == n ? end - start : 0)
                      : GetNthNameSize(n, end + 1, end + 1, counter + 1))
               : GetNthNameSize(n, start, end + 1, counter);
  }